

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void leveldb::log::_Test_BadLength::_RunIt(void)

{
  _Test_BadLength t;
  LogTest LStack_98;
  
  LogTest::LogTest(&LStack_98);
  _Run((_Test_BadLength *)&LStack_98);
  LogTest::~LogTest(&LStack_98);
  return;
}

Assistant:

TEST(LogTest, BadLength) {
  const int kPayloadSize = kBlockSize - kHeaderSize;
  Write(BigString("bar", kPayloadSize));
  Write("foo");
  // Least significant size byte is stored in header[4].
  IncrementByte(4, 1);
  ASSERT_EQ("foo", Read());
  ASSERT_EQ(kBlockSize, DroppedBytes());
  ASSERT_EQ("OK", MatchError("bad record length"));
}